

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

void vector_gautbl_eval_logs3
               (vector_gautbl_t *gautbl,int32 offset,int32 count,float32 *x,int32 *score,
               logmath_t *logmath)

{
  uint uVar1;
  float32 **ppfVar2;
  float32 **ppfVar3;
  float32 *pfVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  float64 fVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  uVar7 = (ulong)(uint)offset;
  fVar8 = logmath_get_base(logmath);
  dVar9 = log((double)fVar8);
  dVar9 = 1.0 / dVar9;
  uVar1 = gautbl->veclen;
  iVar6 = offset + count + -1;
  if (offset < iVar6) {
    ppfVar2 = gautbl->mean;
    ppfVar3 = gautbl->var;
    pfVar4 = gautbl->lrd;
    uVar7 = (ulong)offset;
    fVar8 = gautbl->distfloor;
    do {
      dVar10 = (double)(float)*(undefined8 *)(pfVar4 + uVar7);
      dVar11 = (double)(float)((ulong)*(undefined8 *)(pfVar4 + uVar7) >> 0x20);
      if (0 < (int)uVar1) {
        uVar5 = 0;
        do {
          dVar12 = (double)((float)x[uVar5] - (float)ppfVar2[uVar7][uVar5]);
          dVar15 = (double)((float)x[uVar5] - (float)ppfVar2[uVar7 + 1][uVar5]);
          dVar10 = dVar10 - dVar12 * dVar12 * (double)(float)ppfVar3[uVar7][uVar5];
          dVar11 = dVar11 - dVar15 * dVar15 * (double)(float)ppfVar3[uVar7 + 1][uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      auVar13._8_8_ = fVar8;
      auVar13._0_8_ = fVar8;
      auVar14._8_4_ = SUB84(dVar11,0);
      auVar14._0_8_ = dVar10;
      auVar14._12_4_ = (int)((ulong)dVar11 >> 0x20);
      auVar14 = maxpd(auVar13,auVar14);
      *(ulong *)(score + uVar7) =
           CONCAT44((int)(auVar14._8_8_ * dVar9),(int)(auVar14._0_8_ * dVar9));
      uVar7 = uVar7 + 2;
    } while ((long)uVar7 < (long)iVar6);
  }
  iVar6 = (int)uVar7;
  if (iVar6 < count + offset) {
    dVar10 = (double)(float)gautbl->lrd[iVar6];
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        dVar11 = (double)((float)x[uVar7] - (float)gautbl->mean[iVar6][uVar7]);
        dVar10 = dVar10 - dVar11 * dVar11 * (double)(float)gautbl->var[iVar6][uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    dVar11 = (double)gautbl->distfloor;
    if ((double)gautbl->distfloor <= dVar10) {
      dVar11 = dVar10;
    }
    score[iVar6] = (int)(dVar9 * dVar11);
  }
  return;
}

Assistant:

void
vector_gautbl_eval_logs3(vector_gautbl_t * gautbl,
                         int32 offset,
                         int32 count, float32 * x, int32 * score, logmath_t * logmath)
{
    int32 i, r;
    float64 f;
    int32 end, veclen;
    float32 *m1, *m2, *v1, *v2;
    float64 dval1, dval2, diff1, diff2;

    f = 1.0 / log(logmath_get_base(logmath));

    /* Interleave evaluation of two vectors at a time for speed on pipelined machines */
    end = offset + count;
    veclen = gautbl->veclen;

    for (r = offset; r < end - 1; r += 2) {
        m1 = gautbl->mean[r];
        m2 = gautbl->mean[r + 1];
        v1 = gautbl->var[r];
        v2 = gautbl->var[r + 1];
        dval1 = gautbl->lrd[r];
        dval2 = gautbl->lrd[r + 1];

        for (i = 0; i < veclen; i++) {
            diff1 = x[i] - m1[i];
            dval1 -= diff1 * diff1 * v1[i];
            diff2 = x[i] - m2[i];
            dval2 -= diff2 * diff2 * v2[i];
        }

        if (dval1 < gautbl->distfloor)
            dval1 = gautbl->distfloor;
        if (dval2 < gautbl->distfloor)
            dval2 = gautbl->distfloor;

        score[r] = (int32) (f * dval1);
        score[r + 1] = (int32) (f * dval2);
    }

    if (r < end) {
        m1 = gautbl->mean[r];
        v1 = gautbl->var[r];
        dval1 = gautbl->lrd[r];

        for (i = 0; i < veclen; i++) {
            diff1 = x[i] - m1[i];
            dval1 -= diff1 * diff1 * v1[i];
        }

        if (dval1 < gautbl->distfloor)
            dval1 = gautbl->distfloor;

        score[r] = (int32) (f * dval1);
    }
}